

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa.c
# Opt level: O2

_Bool i2p_eddsa_verify(uint8_t *pubkey,uint8_t *buf,size_t sz,uint8_t *sig)

{
  int iVar1;
  _Bool _Var2;
  uchar rcheck [32];
  uchar h [64];
  ge_p3 A;
  SHA512_CTX sha;
  ge_p2 R;
  
  SHA512_Init((SHA512_CTX *)&sha);
  iVar1 = crypto_sign_ed25519_ref10_ge_frombytes_negate_vartime(&A,pubkey);
  if (iVar1 == 0) {
    SHA512_Update((SHA512_CTX *)&sha,sig,0x20);
    SHA512_Update((SHA512_CTX *)&sha,pubkey,0x20);
    SHA512_Update((SHA512_CTX *)&sha,buf,sz);
    SHA512_Final(h,(SHA512_CTX *)&sha);
    crypto_sign_ed25519_ref10_sc_reduce(h);
    crypto_sign_ed25519_ref10_ge_double_scalarmult_vartime(&R,h,&A,sig + 0x20);
    crypto_sign_ed25519_ref10_ge_tobytes(rcheck,&R);
    iVar1 = crypto_verify_32(rcheck,sig);
    _Var2 = iVar1 == 0;
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool i2p_eddsa_verify(const uint8_t * pubkey, const uint8_t * buf, size_t sz, const uint8_t * sig) {

  unsigned char h[64];
  unsigned char rcheck[32];
  ge_p3 A;
  ge_p2 R;
  SHA512_CTX sha;
  SHA512_Init(&sha);

  if (ge_frombytes_negate_vartime(&A,pubkey) != 0)
  {
    return false;
  }
 
  SHA512_Update(&sha,sig,32);
  SHA512_Update(&sha,pubkey, 32);
  SHA512_Update(&sha,buf,sz);
  SHA512_Final(h, &sha);
  sc_reduce(h);

  ge_double_scalarmult_vartime(&R,h,&A,sig + 32);
  ge_tobytes(rcheck,&R);
  return crypto_verify_32(rcheck, sig) == 0;
}